

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O3

void get_metis(int n,int_t bnz,int_t *b_colptr,int_t *b_rowind,int *perm_c)

{
  return;
}

Assistant:

void get_metis(int n, int_t bnz, int_t *b_colptr,
               int_t *b_rowind, int *perm_c)
{
#ifdef HAVE_METIS
    /*#define METISOPTIONS 8*/
#define METISOPTIONS 40
    int_t metis_options[METISOPTIONS];
    int numflag = 0; /* C-Style ordering */
    int_t i, nm;
    int_t *perm, *iperm;

    extern int METIS_NodeND(int_t*, int_t*, int_t*, int_t*, int_t*,
			    int_t*, int_t*);

    metis_options[0] = 0; /* Use Defaults for now */

    perm = intMalloc(2*n);
    if (!perm) ABORT("intMalloc fails for perm.");
    iperm = perm + n;
    nm = n;

    /* Call metis */
#undef USEEND
#ifdef USEEND
    METIS_EdgeND(&nm, b_colptr, b_rowind, &numflag, metis_options,
		 perm, iperm);
#else

    /* Earlier version 3.x.x */
    /* METIS_NodeND(&nm, b_colptr, b_rowind, &numflag, metis_options,
       perm, iperm);*/

    /* Latest version 4.x.x */
    METIS_NodeND(&nm, b_colptr, b_rowind, NULL, NULL, perm, iperm);

    /*check_perm_dist("metis perm",  n, perm);*/
#endif

    /* Copy the permutation vector into SuperLU data structure. */
    for (i = 0; i < n; ++i) perm_c[i] = iperm[i];

    SUPERLU_FREE(b_colptr);
    SUPERLU_FREE(b_rowind);
    SUPERLU_FREE(perm);
#endif /* HAVE_METIS */
}